

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

int __thiscall
chrono::ChSystemDescriptor::FromVectorToConstraints
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChConstraint *pCVar3;
  int iVar4;
  CoeffReturnType pdVar5;
  size_t ic;
  ulong uVar6;
  
  iVar4 = (*this->_vptr_ChSystemDescriptor[8])();
  this->n_c = iVar4;
  if ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (long)iVar4) {
    ppCVar1 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppCVar2 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (uVar6 = 0; uVar6 < (ulong)(long)(int)((ulong)((long)ppCVar1 - (long)ppCVar2) >> 3);
        uVar6 = uVar6 + 1) {
      pCVar3 = (this->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
      if (pCVar3->active == true) {
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)mvector,
                            (long)pCVar3->offset);
        pCVar3->l_i = *pdVar5;
      }
    }
    return this->n_c;
  }
  __assert_fail("n_c == mvector.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                ,0x19f,
                "virtual int chrono::ChSystemDescriptor::FromVectorToConstraints(const ChVectorDynamic<> &)"
               );
}

Assistant:

int ChSystemDescriptor::FromVectorToConstraints(const ChVectorDynamic<>& mvector) {
    n_c = CountActiveConstraints();

    assert(n_c == mvector.size());

    auto vc_size = (int)vconstraints.size();

    // Fill the vector
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->Set_l_i(mvector(vconstraints[ic]->GetOffset()));
        }
    }

    return n_c;
}